

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab-begin.c
# Opt level: O0

int CheckFromArray(void)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  char *local_a0;
  char *status;
  char buf [128];
  FILE *out;
  
  buf._120_8_ = fopen("out.txt","r");
  if ((FILE *)buf._120_8_ == (FILE *)0x0) {
    printf("can\'t open out.txt\n");
    out._4_4_ = 0xffffffff;
  }
  else {
    memset(&status,0,0x80);
    local_a0 = ScanChars((FILE *)buf._120_8_,0x80,(char *)&status);
    fclose((FILE *)buf._120_8_);
    if (local_a0 == "PASSED") {
      pcVar2 = strchr((char *)&status,0x2e);
      if (pcVar2 != (char *)0x0) {
        sVar3 = strlen((char *)&status);
        sVar4 = strlen((char *)&status);
        strncpy(buf + (sVar3 - 8),"00000000000000000000000000000000",0x7f - sVar4);
      }
    }
    if (local_a0 == "PASSED") {
      pcVar2 = testInOut[testN].out;
      sVar3 = strlen(testInOut[testN].out);
      iVar1 = strncasecmp(pcVar2,(char *)&status,sVar3);
      if (iVar1 != 0) {
        local_a0 = "FAILED";
      }
    }
    printf("%s\n",local_a0);
    out._4_4_ = (uint)(local_a0 == "FAILED");
  }
  testN = testN + 1;
  return out._4_4_;
}

Assistant:

static int CheckFromArray(void) {
    FILE* const out = fopen("out.txt", "r");
    if (out == NULL) {
        printf("can't open out.txt\n");
        testN++;
        return -1;
    }
    char buf[128] = {0};
    const char* status = ScanChars(out, sizeof(buf), buf);
    fclose(out);
    if (status == Pass && strchr(buf, '.')) {
        strncpy(buf + strlen(buf), "0000""0000""0000""0000""0000""0000""0000""0000", sizeof(buf) - strlen(buf) - 1);
    }
    if (status == Pass && _strnicmp(testInOut[testN].out, buf, strlen(testInOut[testN].out)) != 0) {
        status = Fail;
    }
    printf("%s\n", status);
    ++testN;
    return status == Fail;
}